

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O2

void __thiscall
leveldb::anon_unknown_7::TwoLevelIterator::SkipEmptyDataBlocksForward(TwoLevelIterator *this)

{
  while (((this->data_iter_).iter_ == (Iterator *)0x0 || ((this->data_iter_).valid_ == false))) {
    if ((this->index_iter_).valid_ == false) {
      SetDataIterator(this,(Iterator *)0x0);
      return;
    }
    IteratorWrapper::Next(&this->index_iter_);
    InitDataBlock(this);
    if ((this->data_iter_).iter_ != (Iterator *)0x0) {
      IteratorWrapper::SeekToFirst(&this->data_iter_);
    }
  }
  return;
}

Assistant:

void TwoLevelIterator::SkipEmptyDataBlocksForward() {
  while (data_iter_.iter() == nullptr || !data_iter_.Valid()) {
    // Move to next block
    if (!index_iter_.Valid()) {
      SetDataIterator(nullptr);
      return;
    }
    index_iter_.Next();
    InitDataBlock();
    if (data_iter_.iter() != nullptr) data_iter_.SeekToFirst();
  }
}